

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_BoxFanin(Bac_Ntk_t *p,int b,int i)

{
  int iVar1;
  int i_local;
  int b_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_BoxBi(p,b,i);
  iVar1 = Bac_ObjFanin(p,iVar1);
  return iVar1;
}

Assistant:

static inline int            Bac_BoxFanin( Bac_Ntk_t * p, int b, int i )     { return Bac_ObjFanin(p, Bac_BoxBi(p, b, i));                                                 }